

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

optional<absl::lts_20250127::Cord> * __thiscall
absl::lts_20250127::status_internal::StatusRep::GetPayload
          (optional<absl::lts_20250127::Cord> *__return_storage_ptr__,StatusRep *this,
          string_view type_url)

{
  reference pVVar1;
  bool bVar2;
  optional<unsigned_long> oVar3;
  string_view type_url_00;
  
  type_url_00._M_str = type_url._M_str;
  type_url_00._M_len = (size_t)type_url_00._M_str;
  oVar3 = FindPayloadIndexByUrl
                    ((status_internal *)
                     (this->payloads_)._M_t.
                     super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                     ._M_head_impl,(Payloads *)type_url._M_len,type_url_00);
  bVar2 = ((undefined1  [16])
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0;
  if (bVar2) {
    pVVar1 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             ::operator[]((this->payloads_)._M_t.
                          super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                          .
                          super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                          ._M_head_impl,
                          oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_payload);
    std::_Optional_payload_base<absl::lts_20250127::Cord>::_Storage<absl::lts_20250127::Cord,false>
    ::_Storage<absl::lts_20250127::Cord&>
              ((_Storage<absl::lts_20250127::Cord,false> *)__return_storage_ptr__,&pVVar1->payload);
  }
  (__return_storage_ptr__->super__Optional_base<absl::lts_20250127::Cord,_false,_false>)._M_payload.
  super__Optional_payload<absl::lts_20250127::Cord,_true,_false,_false>.
  super__Optional_payload_base<absl::lts_20250127::Cord>._M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

absl::optional<absl::Cord> StatusRep::GetPayload(
    absl::string_view type_url) const {
  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (index.has_value()) return (*payloads_)[index.value()].payload;

  return absl::nullopt;
}